

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fkParentIsModified(Table *pTab,FKey *p,int *aChange,int bChngRowid)

{
  short sVar1;
  int iVar2;
  char *zRight;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long local_50;
  
  iVar2 = p->nCol;
  if (0 < (long)iVar2) {
    sVar1 = pTab->nCol;
    local_50 = 0;
    do {
      if (0 < sVar1) {
        zRight = p->aCol[local_50].zCol;
        lVar4 = 0;
        uVar5 = 0;
        do {
          if ((-1 < aChange[uVar5]) || ((bChngRowid != 0 && (uVar5 == (uint)(int)pTab->iPKey)))) {
            if (zRight == (char *)0x0) {
              if (((&pTab->aCol->colFlags)[lVar4] & 1) != 0) {
                return 1;
              }
            }
            else {
              iVar3 = sqlite3StrICmp(*(char **)((long)&pTab->aCol->zName + lVar4),zRight);
              if (iVar3 == 0) {
                return 1;
              }
            }
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x20;
        } while ((long)sVar1 != uVar5);
      }
      local_50 = local_50 + 1;
    } while (local_50 != iVar2);
  }
  return 0;
}

Assistant:

static int fkParentIsModified(
  Table *pTab, 
  FKey *p, 
  int *aChange, 
  int bChngRowid
){
  int i;
  for(i=0; i<p->nCol; i++){
    char *zKey = p->aCol[i].zCol;
    int iKey;
    for(iKey=0; iKey<pTab->nCol; iKey++){
      if( aChange[iKey]>=0 || (iKey==pTab->iPKey && bChngRowid) ){
        Column *pCol = &pTab->aCol[iKey];
        if( zKey ){
          if( 0==sqlite3StrICmp(pCol->zName, zKey) ) return 1;
        }else if( pCol->colFlags & COLFLAG_PRIMKEY ){
          return 1;
        }
      }
    }
  }
  return 0;
}